

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

void __thiscall
S98Player::RefreshMuting(S98Player *this,S98_CHIPDEV *chipDev,PLR_MUTE_OPTS *muteOpts)

{
  DEV_INFO *devInf;
  S98_CHIPDEV *pSStack_28;
  UINT8 linkCntr;
  VGM_BASEDEV *clDev;
  PLR_MUTE_OPTS *muteOpts_local;
  S98_CHIPDEV *chipDev_local;
  S98Player *this_local;
  
  devInf._7_1_ = 0;
  for (pSStack_28 = chipDev; pSStack_28 != (S98_CHIPDEV *)0x0 && devInf._7_1_ < 2;
      pSStack_28 = (S98_CHIPDEV *)(pSStack_28->base).linkDev) {
    if (((pSStack_28->base).defInf.dataPtr != (DEV_DATA *)0x0) &&
       (((pSStack_28->base).defInf.devDef)->SetMuteMask != (DEVFUNC_OPTMASK)0x0)) {
      (*((pSStack_28->base).defInf.devDef)->SetMuteMask)
                ((pSStack_28->base).defInf.dataPtr,muteOpts->chnMute[0]);
    }
    devInf._7_1_ = devInf._7_1_ + 1;
  }
  return;
}

Assistant:

void S98Player::RefreshMuting(S98_CHIPDEV& chipDev, const PLR_MUTE_OPTS& muteOpts)
{
	VGM_BASEDEV* clDev;
	UINT8 linkCntr = 0;
	
	for (clDev = &chipDev.base; clDev != NULL && linkCntr < 2; clDev = clDev->linkDev, linkCntr ++)
	{
		DEV_INFO* devInf = &clDev->defInf;
		if (devInf->dataPtr != NULL && devInf->devDef->SetMuteMask != NULL)
			devInf->devDef->SetMuteMask(devInf->dataPtr, muteOpts.chnMute[0]);
	}
	
	return;
}